

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplex.cc
# Opt level: O0

Candidate * __thiscall fizplex::Simplex::run_price(Simplex *this,Base *base)

{
  double dVar1;
  LP *lp;
  size_t sVar2;
  double *pdVar3;
  DVector *this_00;
  DVector *in_RSI;
  Candidate *in_RDI;
  size_t i_1;
  size_t i;
  DVector d;
  DVector pi;
  pointer in_stack_ffffffffffffff08;
  ColMatrix *in_stack_ffffffffffffff10;
  double in_stack_ffffffffffffff18;
  DVector *in_stack_ffffffffffffff20;
  DVector *in_stack_ffffffffffffff98;
  DVector *rhs;
  DVector *this_01;
  size_type local_58;
  DVector *in_stack_ffffffffffffffb8;
  Base *in_stack_ffffffffffffffc0;
  
  ColMatrix::row_count((ColMatrix *)(in_RSI->vals)._M_size);
  DVector::DVector((DVector *)in_stack_ffffffffffffff10,(size_t)in_stack_ffffffffffffff08);
  lp = (LP *)ColMatrix::col_count((ColMatrix *)(in_RSI->vals)._M_size);
  DVector::DVector((DVector *)in_stack_ffffffffffffff10,(size_t)in_stack_ffffffffffffff08);
  local_58 = 0;
  while( true ) {
    sVar2 = ColMatrix::row_count((ColMatrix *)(in_RSI->vals)._M_size);
    if (sVar2 <= local_58) break;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&in_RSI->dim,local_58);
    pdVar3 = DVector::operator[](in_stack_ffffffffffffff20,(size_t)in_stack_ffffffffffffff18);
    dVar1 = *pdVar3;
    pdVar3 = DVector::operator[](in_stack_ffffffffffffff20,(size_t)in_stack_ffffffffffffff18);
    *pdVar3 = dVar1;
    local_58 = local_58 + 1;
  }
  Base::btran(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  rhs = (DVector *)0x0;
  while( true ) {
    this_01 = rhs;
    this_00 = (DVector *)ColMatrix::col_count((ColMatrix *)(in_RSI->vals)._M_size);
    if (this_00 <= rhs) break;
    pdVar3 = DVector::operator[](in_stack_ffffffffffffff20,(size_t)in_stack_ffffffffffffff18);
    in_stack_ffffffffffffff20 = (DVector *)*pdVar3;
    ColMatrix::column(in_stack_ffffffffffffff10,(size_t)in_stack_ffffffffffffff08);
    in_stack_ffffffffffffff18 = DVector::operator*(this_00,(SVector *)rhs);
    in_stack_ffffffffffffff08 =
         (pointer)((double)in_stack_ffffffffffffff20 - in_stack_ffffffffffffff18);
    in_stack_ffffffffffffff10 =
         (ColMatrix *)
         DVector::operator[](in_stack_ffffffffffffff20,(size_t)in_stack_ffffffffffffff18);
    (in_stack_ffffffffffffff10->cols).
    super__Vector_base<fizplex::SVector,_std::allocator<fizplex::SVector>_>._M_impl.
    super__Vector_impl_data._M_start = in_stack_ffffffffffffff08;
    rhs = (DVector *)((long)&(this_01->vals)._M_size + 1);
  }
  Pricer::price((Pricer *)this_01,in_stack_ffffffffffffff98,lp,in_RSI,
                (vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_RDI);
  DVector::~DVector((DVector *)0x130691);
  DVector::~DVector((DVector *)0x13069e);
  return in_RDI;
}

Assistant:

Simplex::Candidate Simplex::run_price(const Base &base) const {
  DVector pi(lp.A.row_count());
  DVector d(lp.A.col_count());
  for (size_t i = 0; i < lp.A.row_count(); i++)
    pi[i] = c[basic_indices[i]]; // ==c_B
  base.btran(pi);
  for (size_t i = 0; i < lp.A.col_count(); i++)
    d[i] = c[i] - pi * lp.A.column(i);

  return Pricer().price(x, lp, d, non_basic_indices);
}